

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::Options::TagOptionParser::parseIntoConfig
          (TagOptionParser *this,Command *cmd,ConfigData *config)

{
  pointer *ppTVar1;
  long lVar2;
  pointer pbVar3;
  long lVar4;
  ulong uVar5;
  string groupName;
  TestCaseFilters filters;
  string local_e0;
  ConfigData *local_c0;
  string local_b8;
  TestCaseFilters local_98;
  
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  local_e0._M_string_length = 0;
  local_e0.field_2._M_local_buf[0] = '\0';
  pbVar3 = (cmd->m_args).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_c0 = config;
  if ((cmd->m_args).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar3) {
    lVar4 = 8;
    ppTVar1 = &local_98.m_tagExpressions.
               super__Vector_base<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    uVar5 = 0;
    do {
      if (uVar5 != 0) {
        std::__cxx11::string::append((char *)&local_e0);
        pbVar3 = (cmd->m_args).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      lVar2 = *(long *)((long)pbVar3 + lVar4 + -8);
      local_98.m_tagExpressions.
      super__Vector_base<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)ppTVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,lVar2,
                 *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar4) + lVar2);
      std::__cxx11::string::_M_append
                ((char *)&local_e0,
                 (ulong)local_98.m_tagExpressions.
                        super__Vector_base<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      if (local_98.m_tagExpressions.
          super__Vector_base<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)ppTVar1) {
        operator_delete(local_98.m_tagExpressions.
                        super__Vector_base<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((local_98.m_tagExpressions.
                                         super__Vector_base<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       m_tagSets).
                                       super__Vector_base<Catch::TagSet,_std::allocator<Catch::TagSet>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 1));
      }
      uVar5 = uVar5 + 1;
      pbVar3 = (cmd->m_args).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x20;
    } while (uVar5 < (ulong)((long)(cmd->m_args).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5));
  }
  TestCaseFilters::TestCaseFilters(&local_98,&local_e0);
  pbVar3 = (cmd->m_args).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((cmd->m_args).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar3) {
    lVar4 = 8;
    uVar5 = 0;
    do {
      lVar2 = *(long *)((long)pbVar3 + lVar4 + -8);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,lVar2,
                 *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar4) + lVar2);
      TestCaseFilters::addTags(&local_98,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      uVar5 = uVar5 + 1;
      pbVar3 = (cmd->m_args).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x20;
    } while (uVar5 < (ulong)((long)(cmd->m_args).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5));
  }
  std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::push_back
            (&local_c0->filters,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.m_name._M_dataplus._M_p != &local_98.m_name.field_2) {
    operator_delete(local_98.m_name._M_dataplus._M_p,
                    local_98.m_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::~vector
            (&local_98.m_exclusionFilters);
  std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::~vector
            (&local_98.m_inclusionFilters);
  std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>::~vector
            (&local_98.m_tagExpressions);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                             local_e0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

virtual void parseIntoConfig( const Command& cmd, ConfigData& config ) {
                std::string groupName;
                for( std::size_t i = 0; i < cmd.argsCount(); ++i ) {
                    if( i != 0 )
                        groupName += " ";
                    groupName += cmd[i];
                }
                TestCaseFilters filters( groupName );
                for( std::size_t i = 0; i < cmd.argsCount(); ++i )
                    filters.addTags( cmd[i] );
                config.filters.push_back( filters );
            }